

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stitching.cpp
# Opt level: O1

void simple_append(string *first_geo,string *second_geo,string *output_geo,string *char_len)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  int highest_line_ID;
  int highest_node_ID;
  double offset;
  map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  b_lines_map;
  map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> b_nodes_map;
  map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  a_lines_map;
  map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> a_nodes_map;
  int local_f8 [2];
  double local_f0;
  _Rb_tree<int,_std::pair<const_int,_stitch::line>,_std::_Select1st<std::pair<const_int,_stitch::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  local_e8;
  _Rb_tree<int,_std::pair<const_int,_node>,_std::_Select1st<std::pair<const_int,_node>_>,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
  local_b8;
  _Rb_tree<int,_std::pair<const_int,_stitch::line>,_std::_Select1st<std::pair<const_int,_stitch::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  local_88;
  _Rb_tree<int,_std::pair<const_int,_node>,_std::_Select1st<std::pair<const_int,_node>_>,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
  local_58;
  
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8[1] = 0;
  local_f8[0] = 0;
  local_f0 = 0.0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar1 = read_in_geofiles(first_geo,second_geo,output_geo,
                           (map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                            *)&local_58,
                           (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                            *)&local_88,
                           (map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                            *)&local_b8,
                           (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                            *)&local_e8);
  if (iVar1 == 0) {
    calculate_shifting_parameters
              ((map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> *)
               &local_58,
               (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                *)&local_88,local_f8 + 1,local_f8,&local_f0);
    shift_file_b((map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> *)
                 &local_b8,
                 (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                  *)&local_e8,local_f8 + 1,local_f8,&local_f0);
    print_stitched_file((map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                         *)&local_58,
                        (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                         *)&local_88,
                        (map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                         *)&local_b8,
                        (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                         *)&local_e8,output_geo,char_len);
    lVar2 = 0x1b;
    pcVar3 = "Program finished execution.";
  }
  else {
    lVar2 = 0x22;
    pcVar3 = "Error: unable to read in geofiles.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::
  _Rb_tree<int,_std::pair<const_int,_stitch::line>,_std::_Select1st<std::pair<const_int,_stitch::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  ::~_Rb_tree(&local_e8);
  std::
  _Rb_tree<int,_std::pair<const_int,_node>,_std::_Select1st<std::pair<const_int,_node>_>,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
  ::~_Rb_tree(&local_b8);
  std::
  _Rb_tree<int,_std::pair<const_int,_stitch::line>,_std::_Select1st<std::pair<const_int,_stitch::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  ::~_Rb_tree(&local_88);
  std::
  _Rb_tree<int,_std::pair<const_int,_node>,_std::_Select1st<std::pair<const_int,_node>_>,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void simple_append(     std::string first_geo,
                        std::string second_geo,
                        std::string output_geo,
                        std::string char_len)
{
    std::map<int, node> a_nodes_map;
    std::map<int, stitch::line> a_lines_map;
    std::map<int, node> b_nodes_map;
    std::map<int, stitch::line> b_lines_map;
    int highest_node_ID = 0;
    int highest_line_ID = 0;
    double offset = 0;
    int status = read_in_geofiles(  first_geo, second_geo, output_geo,
                                    a_nodes_map, a_lines_map,
                                    b_nodes_map, b_lines_map);
    if (status==0)
    {
        status = calculate_shifting_parameters( a_nodes_map, a_lines_map, highest_node_ID,
                                                highest_line_ID, offset );
        if (status==0)
        {
            status = shift_file_b(b_nodes_map, b_lines_map, highest_node_ID, highest_line_ID, offset);
            if (status==0)
            {
                print_stitched_file(a_nodes_map, a_lines_map, b_nodes_map, b_lines_map, output_geo, char_len);
                std::cout << "Program finished execution." << endl;
            }
            else
            {
                std::cout << "Shifting of nodes failed."<< endl;
            }
        }
        else
        {
            std::cout << "Error: Failed to calculate shifting parameters." << endl;
        }
    }
    else
    {
        std::cout << "Error: unable to read in geofiles." << endl;
    }
}